

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall
Fl_Tree::item_pathname(Fl_Tree *this,char *pathname,int pathnamelen,Fl_Tree_Item *item)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_68;
  Fl_Tree_Item *local_60;
  int local_4c;
  int len;
  char *name;
  char *pcStack_38;
  int slen;
  char *s;
  Fl_Tree_Item *item_local;
  int pathnamelen_local;
  char *pathname_local;
  Fl_Tree *this_local;
  
  *pathname = '\0';
  local_60 = item;
  if (item == (Fl_Tree_Item *)0x0) {
    local_60 = this->_root;
  }
  s = (char *)local_60;
  if (local_60 == (Fl_Tree_Item *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    name._4_4_ = 1;
    if (pathnamelen < 2) {
      *pathname = '\0';
      this_local._4_4_ = -2;
    }
    else {
      pathname[(long)pathnamelen + -1] = '\0';
      pcStack_38 = pathname + (long)pathnamelen + -2;
      while ((s != (char *)0x0 &&
             ((iVar1 = Fl_Tree_Item::is_root((Fl_Tree_Item *)s), iVar1 == 0 ||
              (iVar1 = showroot(this), iVar1 != 0))))) {
        pcVar2 = Fl_Tree_Item::label((Fl_Tree_Item *)s);
        if (pcVar2 == (char *)0x0) {
          local_68 = "???";
        }
        else {
          local_68 = Fl_Tree_Item::label((Fl_Tree_Item *)s);
        }
        sVar3 = strlen(local_68);
        local_4c = (int)sVar3;
        iVar1 = name._4_4_;
        pcVar2 = pcStack_38;
        while (pcStack_38 = pcVar2, name._4_4_ = iVar1, local_4c = local_4c + -1, -1 < local_4c) {
          if (pathnamelen <= name._4_4_ + 1) {
            *pathname = '\0';
            return -2;
          }
          *pcStack_38 = local_68[local_4c];
          if ((local_68[local_4c] == '/') ||
             (iVar1 = name._4_4_ + 1, pcVar2 = pcStack_38 + -1, local_68[local_4c] == '\\')) {
            if (pathnamelen <= name._4_4_ + 2) {
              *pathname = '\0';
              return -2;
            }
            pcStack_38[-1] = '\\';
            iVar1 = name._4_4_ + 2;
            pcVar2 = pcStack_38 + -2;
          }
        }
        name._4_4_ = name._4_4_ + 1;
        if (pathnamelen <= name._4_4_) {
          *pathname = '\0';
          return -2;
        }
        *pcStack_38 = '/';
        s = (char *)Fl_Tree_Item::parent((Fl_Tree_Item *)s);
        pcStack_38 = pcStack_38 + -1;
      }
      pcVar2 = pcStack_38 + 1;
      if (pcStack_38[1] == '/') {
        name._4_4_ = name._4_4_ + -1;
        pcVar2 = pcStack_38 + 2;
      }
      pcStack_38 = pcVar2;
      if (pcStack_38 != pathname) {
        memmove(pathname,pcStack_38,(long)name._4_4_);
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree::item_pathname(char *pathname, int pathnamelen, const Fl_Tree_Item *item) const {
  pathname[0] = '\0';
  item = item ? item : _root;
  if ( !item ) return(-1);
  // Build pathname starting at end
  char *s = (pathname+pathnamelen-1);
  int slen = 0;			// length of string compiled so far (including NULL)
  SAFE_RCAT('\0');
  while ( item ) {
    if ( item->is_root() && showroot() == 0 ) break;		// don't include root in path if showroot() off
    // Find name of current item
    const char *name = item->label() ? item->label() : "???";	// name for this item
    int len = (int) strlen(name);
    // Add name to end of pathname[]
    for ( --len; len>=0; len-- ) {
      SAFE_RCAT(name[len]);					// rcat name of item
      if ( name[len] == '/' || name[len] == '\\' ) {
        SAFE_RCAT('\\');					// escape front or back slashes within name
      }
    }
    SAFE_RCAT('/');						// rcat leading slash
    item = item->parent();					// move up tree (NULL==root)
  }
  if ( *(++s) == '/' ) { ++s; --slen; }				// leave off leading slash from pathname
  if ( s != pathname ) memmove(pathname, s, slen);	// Shift down right-aligned string
  return(0);
}